

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O0

void swrenderer::R_DeinitPlanes(void)

{
  visplane_s *pvVar1;
  visplane_t *next;
  visplane_t *pl;
  int i;
  
  fakeActive = 0;
  for (pl._4_4_ = 0; pl._4_4_ < 0x81; pl._4_4_ = pl._4_4_ + 1) {
    *(undefined8 *)freehead = *(undefined8 *)(visplanes + (long)pl._4_4_ * 8);
    *(undefined8 *)(visplanes + (long)pl._4_4_ * 8) = 0;
    for (; *(long *)freehead != 0; freehead = *(undefined **)freehead) {
    }
  }
  next = freetail;
  while (next != (visplane_t *)0x0) {
    pvVar1 = next->next;
    free(next);
    next = pvVar1;
  }
  return;
}

Assistant:

void R_DeinitPlanes ()
{
	fakeActive = 0;

	// do not use R_ClearPlanes because at this point the screen pointer is no longer valid.
	for (int i = 0; i <= MAXVISPLANES; i++)	// new code -- killough
	{
		for (*freehead = visplanes[i], visplanes[i] = NULL; *freehead; )
		{
			freehead = &(*freehead)->next;
		}
	}
	for (visplane_t *pl = freetail; pl != NULL; )
	{
		visplane_t *next = pl->next;
		free (pl);
		pl = next;
	}
}